

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.h
# Opt level: O0

bool __thiscall Complex::operator<(Complex *this,Complex *a)

{
  bool bVar1;
  pair<Rational,_Rational> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffee4;
  Rational *in_stack_fffffffffffffee8;
  
  std::make_pair<Rational_const&,Rational_const&>
            (in_stack_fffffffffffffee8,
             (Rational *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  std::make_pair<Rational_const&,Rational_const&>
            (in_stack_fffffffffffffee8,
             (Rational *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  bVar1 = std::operator<((pair<Rational,_Rational> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffed8);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffee0);
  std::pair<Rational,_Rational>::~pair
            ((pair<Rational,_Rational> *)CONCAT44(in_stack_fffffffffffffee4,uVar2));
  std::pair<Rational,_Rational>::~pair
            ((pair<Rational,_Rational> *)CONCAT44(in_stack_fffffffffffffee4,uVar2));
  return (bool)((byte)((uint)uVar2 >> 0x18) & 1);
}

Assistant:

bool operator<(const Complex &a) const
    {
        return std::make_pair(_re, _im) < std::make_pair(a._re, a._im);
    }